

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int linklist_5_3::create_tail(LinkList *list,int *a,int n)

{
  sqlist_5_3 *this;
  sqlist_5_3 *psVar1;
  ulong uVar2;
  LinkList list_00;
  ulong uVar3;
  
  list_00 = (LinkList)a;
  this = (sqlist_5_3 *)malloc(0x10);
  *(undefined8 *)(this + 8) = 0;
  uVar3 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    psVar1 = (sqlist_5_3 *)malloc(0x10);
    *(int *)psVar1 = a[uVar3];
    *(sqlist_5_3 **)(this + 8) = psVar1;
    this = psVar1;
  }
  sqlist_5_3::test_1(this,list_00);
}

Assistant:

int create_tail(LinkList &list, int *a, int n = 10) {
        LinkList q = newNode, p;
        q->next = nullptr;
        for (int i = 0; i < n; i++) {
            p = newNode;
            p->data = a[i];
            q->next = p;
            q = p;
        }
        ps_link_list(q);
    }